

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeTetra>::FirstShapeIndex(TPZVec<long> *Index,int *scalarorders)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  TPZVec<long> *in_RDI;
  int temp;
  int sideorder;
  int iside;
  long in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int local_14;
  
  plVar3 = TPZVec<long>::operator[](in_RDI,0);
  *plVar3 = 0;
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    plVar3 = TPZVec<long>::operator[](in_RDI,(long)local_14);
    lVar1 = *plVar3;
    iVar2 = pzshape::TPZShapeTetra::NConnectShapeF
                      (in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    in_stack_ffffffffffffffd8 = (long)((int)lVar1 + iVar2);
    plVar3 = TPZVec<long>::operator[](in_RDI,(long)(local_14 + 1));
    *plVar3 = in_stack_ffffffffffffffd8;
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FirstShapeIndex(TPZVec<int64_t> &Index, int &scalarorders) {
    Index[0] = 0;

    for(int iside=0;iside<TSHAPE::NSides;iside++)
    {
        int sideorder = 1;
        if (iside >= TSHAPE::NCornerNodes) {
            sideorder = scalarorders;
        }
        int temp = Index[iside] + TSHAPE::NConnectShapeF(iside,sideorder);
        Index[iside+1] = temp;
    }
}